

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colmatrix_test.cc
# Opt level: O2

void __thiscall
fizplex::ColMatrix_AssignmentOperator_Test::TestBody(ColMatrix_AssignmentOperator_Test *this)

{
  long lVar1;
  char *message;
  initializer_list<fizplex::SVector::Nonzero> l;
  initializer_list<fizplex::SVector::Nonzero> l_00;
  initializer_list<fizplex::SVector::Nonzero> l_01;
  initializer_list<fizplex::SVector> colList;
  AssertionResult gtest_ar;
  SVector local_128;
  SVector local_110;
  ColMatrix m33;
  ColMatrix m11;
  Nonzero local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Nonzero local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Nonzero local_48;
  undefined8 local_38;
  undefined1 *puStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  ColMatrix::ColMatrix(&m11,1,1);
  local_58 = 1;
  uStack_50 = 0;
  local_68 = 2;
  uStack_60 = 0xc008000000000000;
  local_78.index = 0;
  local_78.value = 7.0;
  l._M_len = 3;
  l._M_array = &local_78;
  SVector::SVector((SVector *)&gtest_ar,l);
  local_88 = 2;
  uStack_80 = 0x4010000000000000;
  local_98 = 1;
  uStack_90 = 0x4008000000000000;
  local_a8.index = 0;
  local_a8.value = 2.0;
  l_00._M_len = 3;
  l_00._M_array = &local_a8;
  SVector::SVector(&local_128,l_00);
  local_28 = 2;
  uStack_20 = 0xc000000000000000;
  local_38 = 1;
  puStack_30 = &DAT_bff0000000000000;
  local_48.index = 0;
  local_48.value = 1.0;
  l_01._M_len = 3;
  l_01._M_array = &local_48;
  SVector::SVector(&local_110,l_01);
  colList._M_len = 3;
  colList._M_array = (iterator)&gtest_ar;
  ColMatrix::ColMatrix(&m33,3,3,colList);
  lVar1 = 0x30;
  do {
    std::_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::
    ~_Vector_base((_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                   *)(&gtest_ar.success_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  ColMatrix::operator=(&m11,&m33);
  testing::internal::CmpHelperEQ<fizplex::ColMatrix,fizplex::ColMatrix>
            ((internal *)&gtest_ar,"m33","m11",&m33,&m11);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,0x33,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&m33.cols);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&m11.cols);
  return;
}

Assistant:

TEST(ColMatrix, AssignmentOperator) {
  ColMatrix m11(1, 1);
  const ColMatrix m33(3, 3,
                      {{{0, 7}, {2, -3}, {1, 0.0}},
                       {{0, 2}, {1, 3}, {2, 4}},
                       {{0, 1}, {1, -1}, {2, -2}}});
  m11 = m33;
  EXPECT_EQ(m33, m11);
}